

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

int google::protobuf::internal::WireFormatLite::TagSize(int field_number,FieldType type)

{
  int result;
  FieldType type_local;
  int field_number_local;
  
  type_local = io::CodedOutputStream::VarintSize32(field_number << 3);
  if (type == TYPE_GROUP) {
    type_local = type_local << 1;
  }
  return type_local;
}

Assistant:

inline int WireFormatLite::TagSize(int field_number,
                                   WireFormatLite::FieldType type) {
  int result = io::CodedOutputStream::VarintSize32(
    field_number << kTagTypeBits);
  if (type == TYPE_GROUP) {
    // Groups have both a start and an end tag.
    return result * 2;
  } else {
    return result;
  }
}